

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenTest.cpp
# Opt level: O2

void __thiscall UnitTest1::CodeGenTest::DFACodeGenTest1(CodeGenTest *this)

{
  FILE *__stream;
  char *local_2c8;
  char buf2 [9];
  void *local_2b0;
  NFA<char> nfa;
  char buf [13];
  DFA<char> dfa;
  FileLogger logger;
  Stream stream;
  DFARoutineEM64T<char> dfa_routine;
  
  std::__cxx11::wstring::wstring((wstring *)&dfa_routine,L"(abc)+def",(allocator *)&nfa);
  Centaurus::Stream::Stream(&stream,(wstring *)&dfa_routine);
  std::__cxx11::wstring::~wstring((wstring *)&dfa_routine);
  Centaurus::NFA<char>::NFA(&nfa,&stream);
  Centaurus::DFA<char>::DFA(&dfa,&nfa,true);
  __stream = fopen("dfaroutine.asm","w");
  asmjit::FileLogger::FileLogger(&logger,(FILE *)__stream);
  Centaurus::DFARoutineEM64T<char>::DFARoutineEM64T(&dfa_routine,&dfa,(Logger *)0x0);
  fflush(__stream);
  local_2c8 = buf + 0xc;
  builtin_strncpy(buf2,"abcabcde",9);
  builtin_strncpy(buf + 8,"cdef",5);
  builtin_strncpy(buf,"abcabcab",8);
  local_2b0 = Centaurus::DFARoutineEM64T<char>::operator()(&dfa_routine,buf);
  Microsoft::VisualStudio::CppUnitTestFramework::Assert::AreEqual<void_const*>
            (&local_2c8,&local_2b0,(wchar_t *)0x0);
  local_2c8 = (char *)0x0;
  local_2b0 = Centaurus::DFARoutineEM64T<char>::operator()(&dfa_routine,buf2);
  Microsoft::VisualStudio::CppUnitTestFramework::Assert::AreEqual<void_const*>
            (&local_2c8,&local_2b0,(wchar_t *)0x0);
  Centaurus::DFARoutineEM64T<char>::~DFARoutineEM64T(&dfa_routine);
  asmjit::FileLogger::~FileLogger(&logger);
  Centaurus::NFABase<Centaurus::DFAState<char>_>::~NFABase
            (&dfa.super_NFABase<Centaurus::DFAState<char>_>);
  Centaurus::NFABase<Centaurus::NFABaseState<char,_int>_>::~NFABase
            (&nfa.super_NFABase<Centaurus::NFABaseState<char,_int>_>);
  Centaurus::Stream::~Stream(&stream);
  return;
}

Assistant:

TEST_METHOD(DFACodeGenTest1)
    {
        using namespace Centaurus;

        Stream stream(L"(abc)+def");
        NFA<char> nfa(stream);
        DFA<char> dfa(nfa);

        FILE *logfile;
        logfile = fopen("dfaroutine.asm", "w");
        asmjit::FileLogger logger(logfile);

        DFARoutineEM64T<char> dfa_routine(dfa);

        fflush(logfile);

        const char buf[] = "abcabcabcdef";
        const char buf2[] = "abcabcde";

        Assert::AreEqual((const void *)(buf + sizeof(buf) - 1), dfa_routine(buf));
        Assert::AreEqual((const void *)NULL, dfa_routine(buf2));
    }